

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void dump<float>(char *name,float *frames,size_t count)

{
  FILE *__s;
  size_t sVar1;
  
  __s = fopen(name,"wb");
  if (__s != (FILE *)0x0) {
    sVar1 = fwrite(frames,4,count,__s);
    if (sVar1 != count) {
      fprintf(_stderr,"error writing to %s\n",name);
    }
    fclose(__s);
    return;
  }
  fprintf(_stderr,"error opening %s\n",name);
  return;
}

Assistant:

void dump(const char * name, T * frames, size_t count)
{
  FILE * file;
  fopen_portable(&file, name, "wb");

  if (!file) {
    fprintf(stderr, "error opening %s\n", name);
    return;
  }

  if (count != fwrite(frames, sizeof(T), count, file)) {
    fprintf(stderr, "error writing to %s\n", name);
  }
  fclose(file);
}